

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

void xfer_upload_data(fxp_xfer *xfer,char *buffer,int len)

{
  req *data;
  sftp_request *req_00;
  sftp_request *req;
  req *rr;
  int len_local;
  char *buffer_local;
  fxp_xfer *xfer_local;
  
  data = (req *)safemalloc(1,0x30,0);
  data->offset = xfer->offset;
  data->complete = 0;
  if (xfer->tail == (req *)0x0) {
    xfer->head = data;
    data->prev = (req *)0x0;
  }
  else {
    xfer->tail->next = data;
    data->prev = xfer->tail;
  }
  xfer->tail = data;
  data->next = (req *)0x0;
  data->len = len;
  data->buffer = (char *)0x0;
  req_00 = fxp_write_send(xfer->fh,buffer,data->offset,len);
  sftp_register(req_00);
  fxp_set_userdata(req_00,data);
  xfer->offset = (long)data->len + xfer->offset;
  xfer->req_totalsize = data->len + xfer->req_totalsize;
  return;
}

Assistant:

void xfer_upload_data(struct fxp_xfer *xfer, char *buffer, int len)
{
    struct req *rr;
    struct sftp_request *req;

    rr = snew(struct req);
    rr->offset = xfer->offset;
    rr->complete = 0;
    if (xfer->tail) {
        xfer->tail->next = rr;
        rr->prev = xfer->tail;
    } else {
        xfer->head = rr;
        rr->prev = NULL;
    }
    xfer->tail = rr;
    rr->next = NULL;

    rr->len = len;
    rr->buffer = NULL;
    sftp_register(req = fxp_write_send(xfer->fh, buffer, rr->offset, len));
    fxp_set_userdata(req, rr);

    xfer->offset += rr->len;
    xfer->req_totalsize += rr->len;

#ifdef DEBUG_UPLOAD
    printf("queueing write request %p at %"PRIu64" [len %d]\n",
           rr, rr->offset, len);
#endif
}